

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O0

void exprnode_dump(BinarySink *bs,ExprNode *en,char *origtext)

{
  BinarySink *pBVar1;
  void *pvVar2;
  void *pvVar3;
  char *str;
  ptrlen pVar4;
  ulong local_38;
  size_t i;
  char *origtext_local;
  ExprNode *en_local;
  BinarySink *bs_local;
  
  pBVar1 = bs->binarysink_;
  pvVar2 = (en->text).ptr;
  pvVar3 = ptrlen_end(en->text);
  BinarySink_put_fmt(pBVar1,"(%zu:%zu ",(long)pvVar2 - (long)origtext,(long)pvVar3 - (long)origtext)
  ;
  switch(en->op) {
  case OP_AND:
  case OP_OR:
    pBVar1 = bs->binarysink_;
    str = "or";
    if (en->op == OP_AND) {
      str = "and";
    }
    pVar4 = ptrlen_from_asciz(str);
    BinarySink_put_datapl(pBVar1,pVar4);
    for (local_38 = 0; local_38 < (en->field_2).field_0.nsubexprs; local_38 = local_38 + 1) {
      BinarySink_put_byte(bs->binarysink_,' ');
      exprnode_dump(bs,(en->field_2).field_0.subexprs[local_38],origtext);
    }
    break;
  case OP_NOT:
    pBVar1 = bs->binarysink_;
    pVar4 = ptrlen_from_asciz("not ");
    BinarySink_put_datapl(pBVar1,pVar4);
    exprnode_dump(bs,(ExprNode *)(en->field_2).field_0.subexprs,origtext);
    break;
  case OP_HOSTNAME_WC:
    pBVar1 = bs->binarysink_;
    pVar4 = ptrlen_from_asciz("host-wc \'");
    BinarySink_put_datapl(pBVar1,pVar4);
    pBVar1 = bs->binarysink_;
    pVar4 = ptrlen_from_asciz((char *)(en->field_2).field_0.subexprs);
    BinarySink_put_datapl(pBVar1,pVar4);
    BinarySink_put_byte(bs->binarysink_,'\'');
    break;
  case OP_PORT_RANGE:
    BinarySink_put_fmt(bs->binarysink_,"port-range %u %u",(ulong)(en->field_2).field_3.lo,
                       (ulong)(en->field_2).field_3.hi);
    break;
  default:
    __assert_fail("false && \"unhandled node type in exprnode_dump\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/cert-expr.c"
                  ,0x2c2,"void exprnode_dump(BinarySink *, ExprNode *, const char *)");
  }
  BinarySink_put_byte(bs->binarysink_,')');
  return;
}

Assistant:

static void exprnode_dump(BinarySink *bs, ExprNode *en, const char *origtext)
{
    put_fmt(bs, "(%zu:%zu ",
            (size_t)((const char *)en->text.ptr - origtext),
            (size_t)((const char *)ptrlen_end(en->text) - origtext));
    switch (en->op) {
      case OP_AND:
      case OP_OR:
        put_dataz(bs, en->op == OP_AND ? "and" : "or");
        for (size_t i = 0; i < en->nsubexprs; i++) {
            put_byte(bs, ' ');
            exprnode_dump(bs, en->subexprs[i], origtext);
        }
        break;
      case OP_NOT:
        put_dataz(bs, "not ");
        exprnode_dump(bs, en->subexpr, origtext);
        break;
      case OP_HOSTNAME_WC:
        put_dataz(bs, "host-wc '");
        put_dataz(bs, en->wc);
        put_byte(bs, '\'');
        break;
      case OP_PORT_RANGE:
        put_fmt(bs, "port-range %u %u", en->lo, en->hi);
        break;
      default:
        unreachable("unhandled node type in exprnode_dump");
    }
    put_byte(bs, ')');
}